

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  int iVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar10 = horizontal_coefficients + 4;
  do {
    lVar11 = (long)(horizontal_contributors->n0 * 4);
    pfVar8 = decode_buffer + lVar11;
    fVar14 = *horizontal_coefficients;
    fVar17 = horizontal_coefficients[1];
    fVar15 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar18 = fVar15 * pfVar8[8] + *pfVar8 * fVar14;
    fVar19 = fVar15 * pfVar8[9] + pfVar8[1] * fVar14;
    fVar20 = fVar15 * pfVar8[10] + pfVar8[2] * fVar14;
    fVar21 = fVar15 * pfVar8[0xb] + pfVar8[3] * fVar14;
    fVar14 = fVar2 * pfVar8[0xc] + fVar17 * pfVar8[4];
    fVar15 = fVar2 * pfVar8[0xd] + fVar17 * pfVar8[5];
    fVar16 = fVar2 * pfVar8[0xe] + fVar17 * pfVar8[6];
    fVar17 = fVar2 * pfVar8[0xf] + fVar17 * pfVar8[7];
    iVar9 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -2 >> 2) + 1;
    pfVar8 = decode_buffer + lVar11 + 0x10;
    pfVar13 = pfVar10;
    do {
      pfVar12 = pfVar8;
      fVar2 = *pfVar13;
      fVar3 = pfVar13[1];
      fVar4 = pfVar13[2];
      fVar5 = pfVar13[3];
      fVar18 = fVar4 * pfVar12[8] + *pfVar12 * fVar2 + fVar18;
      fVar19 = fVar4 * pfVar12[9] + pfVar12[1] * fVar2 + fVar19;
      fVar20 = fVar4 * pfVar12[10] + pfVar12[2] * fVar2 + fVar20;
      fVar21 = fVar4 * pfVar12[0xb] + pfVar12[3] * fVar2 + fVar21;
      fVar14 = fVar5 * pfVar12[0xc] + fVar3 * pfVar12[4] + fVar14;
      fVar15 = fVar5 * pfVar12[0xd] + fVar3 * pfVar12[5] + fVar15;
      fVar16 = fVar5 * pfVar12[0xe] + fVar3 * pfVar12[6] + fVar16;
      fVar17 = fVar5 * pfVar12[0xf] + fVar3 * pfVar12[7] + fVar17;
      iVar9 = iVar9 + -1;
      pfVar13 = pfVar13 + 4;
      pfVar8 = pfVar12 + 0x10;
    } while (1 < iVar9);
    fVar22 = (float)*(undefined8 *)pfVar13;
    fVar23 = (float)((ulong)*(undefined8 *)pfVar13 >> 0x20);
    fVar2 = pfVar12[0x11];
    fVar3 = pfVar12[0x12];
    fVar4 = pfVar12[0x13];
    fVar5 = pfVar12[0x15];
    fVar6 = pfVar12[0x16];
    fVar7 = pfVar12[0x17];
    *output_buffer = fVar14 + fVar23 * pfVar12[0x14] + fVar18 + pfVar12[0x10] * fVar22;
    output_buffer[1] = fVar15 + fVar23 * fVar5 + fVar19 + fVar2 * fVar22;
    output_buffer[2] = fVar16 + fVar23 * fVar6 + fVar20 + fVar3 * fVar22;
    output_buffer[3] = fVar17 + fVar23 * fVar7 + fVar21 + fVar4 * fVar22;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar10 = pfVar10 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}